

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool __thiscall
cmForEachCommand::HandleInMode
          (cmForEachCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmForEachFunctionBlocker *pcVar3;
  const_reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  char *pcVar7;
  ostream *poVar8;
  string local_208;
  undefined1 local_1e8 [8];
  ostringstream e;
  allocator local_69;
  string local_68;
  char *local_48;
  char *value;
  int local_38;
  uint i;
  Doing doing;
  auto_ptr<cmForEachFunctionBlocker> local_28;
  auto_ptr<cmForEachFunctionBlocker> f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmForEachCommand *this_local;
  
  f.x_ = (cmForEachFunctionBlocker *)args;
  pcVar3 = (cmForEachFunctionBlocker *)operator_new(0x90);
  cmForEachFunctionBlocker::cmForEachFunctionBlocker(pcVar3,(this->super_cmCommand).Makefile);
  cmsys::auto_ptr<cmForEachFunctionBlocker>::auto_ptr(&local_28,pcVar3);
  pcVar3 = cmsys::auto_ptr<cmForEachFunctionBlocker>::operator->(&local_28);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)f.x_,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pcVar3->Args,pvVar4);
  local_38 = 0;
  value._4_4_ = 2;
  do {
    uVar5 = (ulong)value._4_4_;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)f.x_);
    if (sVar6 <= uVar5) {
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar3 = cmsys::auto_ptr<cmForEachFunctionBlocker>::release(&local_28);
      cmMakefile::AddFunctionBlocker(pcVar1,&pcVar3->super_cmFunctionBlocker);
LAB_005de796:
      cmsys::auto_ptr<cmForEachFunctionBlocker>::~auto_ptr(&local_28);
      return true;
    }
    if (local_38 == 2) {
      pcVar3 = cmsys::auto_ptr<cmForEachFunctionBlocker>::operator->(&local_28);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)f.x_,(ulong)value._4_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pcVar3->Args,pvVar4);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)f.x_,(ulong)value._4_4_);
      bVar2 = std::operator==(pvVar4,"LISTS");
      if (bVar2) {
        local_38 = 1;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)f.x_,(ulong)value._4_4_);
        bVar2 = std::operator==(pvVar4,"ITEMS");
        if (bVar2) {
          local_38 = 2;
        }
        else {
          if (local_38 != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            poVar8 = std::operator<<((ostream *)local_1e8,"Unknown argument:\n");
            poVar8 = std::operator<<(poVar8,"  ");
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)f.x_,(ulong)value._4_4_);
            poVar8 = std::operator<<(poVar8,(string *)pvVar4);
            std::operator<<(poVar8,"\n");
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            goto LAB_005de796;
          }
          pcVar1 = (this->super_cmCommand).Makefile;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)f.x_,(ulong)value._4_4_);
          pcVar7 = cmMakefile::GetDefinition(pcVar1,pvVar4);
          local_48 = pcVar7;
          if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_68,pcVar7,&local_69);
            pcVar3 = cmsys::auto_ptr<cmForEachFunctionBlocker>::operator->(&local_28);
            cmSystemTools::ExpandListArgument(&local_68,&pcVar3->Args,true);
            std::__cxx11::string::~string((string *)&local_68);
            std::allocator<char>::~allocator((allocator<char> *)&local_69);
          }
        }
      }
    }
    value._4_4_ = value._4_4_ + 1;
  } while( true );
}

Assistant:

bool cmForEachCommand::HandleInMode(std::vector<std::string> const& args)
{
  cmsys::auto_ptr<cmForEachFunctionBlocker>
    f(new cmForEachFunctionBlocker(this->Makefile));
  f->Args.push_back(args[0]);

  enum Doing { DoingNone, DoingLists, DoingItems };
  Doing doing = DoingNone;
  for(unsigned int i=2; i < args.size(); ++i)
    {
    if(doing == DoingItems)
      {
      f->Args.push_back(args[i]);
      }
    else if(args[i] == "LISTS")
      {
      doing = DoingLists;
      }
    else if(args[i] == "ITEMS")
      {
      doing = DoingItems;
      }
    else if(doing == DoingLists)
      {
      const char* value = this->Makefile->GetDefinition(args[i]);
      if(value && *value)
        {
        cmSystemTools::ExpandListArgument(value, f->Args, true);
        }
      }
    else
      {
      std::ostringstream e;
      e << "Unknown argument:\n" << "  " << args[i] << "\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return true;
      }
    }

  this->Makefile->AddFunctionBlocker(f.release()); // TODO: pass auto_ptr

  return true;
}